

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp_world.cpp
# Opt level: O2

bool __thiscall despot::POMDPWorld::ExecuteAction(POMDPWorld *this,ACT_TYPE action,OBS_TYPE *obs)

{
  State *pSVar1;
  DSPOMDP *pDVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)action;
  iVar3 = (*this->model_->_vptr_DSPOMDP[5])();
  if (iVar3 <= action) {
    poVar4 = std::operator<<((ostream *)&std::cout,"WARNING: Planned action ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,action);
    poVar4 = std::operator<<(poVar4," set to maximum allowed value ");
    iVar3 = (*this->model_->_vptr_DSPOMDP[5])();
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3 + -1);
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = (*this->model_->_vptr_DSPOMDP[5])();
    uVar5 = (ulong)(iVar3 - 1);
  }
  pSVar1 = (this->super_World).state_;
  pDVar2 = this->model_;
  Random::NextDouble(&this->random_);
  iVar3 = (*pDVar2->_vptr_DSPOMDP[2])(pDVar2,pSVar1,uVar5,&this->step_reward_,obs);
  return SUB41(iVar3,0);
}

Assistant:

bool POMDPWorld::ExecuteAction(ACT_TYPE action, OBS_TYPE& obs) {
	if (action >= model_->NumActions()) {
		cout << "WARNING: Planned action " << action << 
			" set to maximum allowed value " << (model_->NumActions() - 1) << endl;
		action = model_->NumActions() - 1;
	}
	bool terminal = model_->Step(*state_, random_.NextDouble(), action,
			step_reward_, obs);
	return terminal;
}